

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::DoubleToDecimalCast<double,int>
               (double input,int *result,CastParameters *parameters,uint8_t width,uint8_t scale)

{
  double dVar1;
  int iVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  uchar in_R8B;
  double input_00;
  string error;
  allocator local_79;
  double local_78;
  Exception local_70 [2];
  string local_50;
  
  local_78 = input;
  input_00 = round(*(double *)
                    (NumericHelper::DOUBLE_POWERS_OF_TEN +
                    (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8) * input);
  dVar1 = *(double *)
           (NumericHelper::DOUBLE_POWERS_OF_TEN +
           (CONCAT71(in_register_00000011,width) & 0xffffffff) * 8);
  if (-dVar1 < input_00 && input_00 < dVar1) {
    iVar2 = Cast::Operation<double,int>(input_00);
    *result = iVar2;
  }
  else {
    ::std::__cxx11::string::string
              ((string *)local_70,"Could not cast value %f to DECIMAL(%d,%d)",&local_79);
    Exception::ConstructMessage<double,unsigned_char,unsigned_char>
              (&local_50,local_70,(string *)(ulong)width,local_78,scale,in_R8B);
    ::std::__cxx11::string::~string((string *)local_70);
    HandleCastError::AssignError(&local_50,parameters);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return -dVar1 < input_00 && input_00 < dVar1;
}

Assistant:

bool DoubleToDecimalCast(SRC input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	double value = input * NumericHelper::DOUBLE_POWERS_OF_TEN[scale];
	double roundedValue = round(value);
	if (roundedValue <= -NumericHelper::DOUBLE_POWERS_OF_TEN[width] ||
	    roundedValue >= NumericHelper::DOUBLE_POWERS_OF_TEN[width]) {
		string error = StringUtil::Format("Could not cast value %f to DECIMAL(%d,%d)", input, width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	// For some reason PG does not use statistical rounding here (even though it _does_ for integers...)
	result = Cast::Operation<SRC, DST>(static_cast<SRC>(roundedValue));
	return true;
}